

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavaOPL3.hpp
# Opt level: O2

void __thiscall ADL_JavaOPL3::OPL3::Update(OPL3 *this,float *output,int numsamples)

{
  Channel *pCVar1;
  int iVar2;
  long lVar3;
  int channelNumber;
  long lVar4;
  Channel *(*papCVar5) [9];
  bool bVar6;
  double extraout_XMM0_Qa;
  
  while (bVar6 = numsamples != 0, numsamples = numsamples + -1, bVar6) {
    papCVar5 = this->channels;
    for (lVar3 = 0; lVar3 <= this->_new; lVar3 = lVar3 + 1) {
      for (lVar4 = 0; lVar4 != 9; lVar4 = lVar4 + 1) {
        pCVar1 = (*papCVar5)[lVar4];
        if (pCVar1 != &(this->disabledChannel).super_Channel) {
          (*pCVar1->_vptr_Channel[2])(pCVar1,this);
          *(ulong *)output =
               CONCAT44((float)((ulong)*(undefined8 *)output >> 0x20) +
                        (float)(extraout_XMM0_Qa * pCVar1->rightPan),
                        (float)*(undefined8 *)output + (float)(extraout_XMM0_Qa * pCVar1->leftPan));
        }
      }
      papCVar5 = papCVar5 + 1;
    }
    this->vibratoIndex = this->vibratoIndex + 1U & 0x1fff;
    iVar2 = this->tremoloIndex + 1;
    if (0x347a < this->tremoloIndex) {
      iVar2 = 0;
    }
    this->tremoloIndex = iVar2;
    output = output + 2;
  }
  return;
}

Assistant:

void OPL3::Update(float *output, int numsamples) {
	while (numsamples--) {
		// If _new = 0, use OPL2 mode with 9 channels. If _new = 1, use OPL3 18 channels;
		for(int array=0; array < (_new + 1); array++)
			for(int channelNumber=0; channelNumber < 9; channelNumber++) {
				// Reads output from each OPL3 channel, and accumulates it in the output buffer:
				Channel *channel = channels[array][channelNumber];
				if (channel != &disabledChannel)
				{
					double channelOutput = channel->getChannelOutput(this);
					output[0] += float(channelOutput * channel->leftPan);
					output[1] += float(channelOutput * channel->rightPan);
				}
			}

		// Advances the OPL3-wide vibrato index, which is used by 
		// PhaseGenerator.getPhase() in each Operator.
		vibratoIndex = (vibratoIndex + 1) & (OPL3DataStruct::vibratoTableLength - 1);
		// Advances the OPL3-wide tremolo index, which is used by 
		// EnvelopeGenerator.getEnvelope() in each Operator.
		tremoloIndex++;
		if(tremoloIndex >= OPL3DataStruct::tremoloTableLength) tremoloIndex = 0;
		output += 2;
	}
}